

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

root_type * __thiscall
ising::free_energy::
specific_heat<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>>
          (root_type *__return_storage_ptr__,free_energy *this,
          fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
          *f,fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
             *beta)

{
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> f1;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_2b0;
  type local_260;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_210;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_1c0;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_170;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> b0;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> f2;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> f0;
  
  boost::math::differentiation::autodiff_v1::detail::
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  ::derivative<int>(&f0,(fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                         *)this,0);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  ::derivative<int>(&f1,(fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                         *)this,1);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  ::derivative<int>(&f2,(fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                         *)this,2);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  ::derivative<int>(&b0,f,0);
  ::operator*(&local_1c0,&b0,&b0);
  ::operator*(&local_260,2,&f1);
  ::operator*(&local_2b0,&b0,&f2);
  operator+(&local_210,&local_260,&local_2b0);
  ::operator*(&local_170,&local_1c0,&local_210);
  ::operator-(__return_storage_ptr__,&local_170);
  return __return_storage_ptr__;
}

Assistant:

inline typename U::root_type specific_heat(U f, U beta) {
  auto f0 = f.derivative(0);
  auto f1 = f.derivative(1);
  auto f2 = f.derivative(2);
  auto b0 = beta.derivative(0);
  return -(b0 * b0 * (2 * f1 + b0 * f2));
}